

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint data,Adaptive_Data_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = this->base;
  uVar4 = this->length >> 0xf;
  uVar3 = M->distribution[data];
  if (M->last_symbol == data) {
    uVar5 = uVar4 * uVar3 + uVar2;
    this->base = uVar5;
    uVar4 = this->length - uVar4 * uVar3;
  }
  else {
    this->length = uVar4;
    uVar5 = uVar4 * uVar3 + uVar2;
    this->base = uVar5;
    uVar4 = (M->distribution[data + 1] - uVar3) * uVar4;
  }
  this->length = uVar4;
  if (uVar5 < uVar2) {
    propagate_carry(this);
    uVar4 = this->length;
  }
  if (uVar4 < 0x1000000) {
    renorm_enc_interval(this);
  }
  M->symbol_count[data] = M->symbol_count[data] + 1;
  puVar1 = &M->symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  Adaptive_Data_Model::update(M,true);
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned data,
                                  Adaptive_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
      if (data >= M.data_symbols) 
      {
          AC_Error("invalid data symbol");
      }
    #endif

      unsigned x, init_base = base;
                                                               // compute products
      if (data == M.last_symbol) {
        x = M.distribution[data] * (length >> DM__LengthShift);
        base   += x;                                            // update interval
        length -= x;                                          // no product needed
      }
      else {
        x = M.distribution[data] * (length >>= DM__LengthShift);
        base   += x;                                            // update interval
        length  = M.distribution[data+1] * length - x;
      }

      if (init_base > base) propagate_carry();                 // overflow = carry

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization

      ++M.symbol_count[data];
      if (--M.symbols_until_update == 0) M.update(true);  // periodic model update
    }